

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# wcwidth.c
# Opt level: O0

int mk_wcswidth(uint *pwcs,size_t n)

{
  size_t sVar1;
  int iVar2;
  int local_28;
  int width;
  int w;
  size_t n_local;
  uint *pwcs_local;
  
  local_28 = 0;
  _width = n;
  n_local = (size_t)pwcs;
  while( true ) {
    sVar1 = _width;
    if (*(int *)n_local != 0) {
      _width = _width - 1;
    }
    if (*(int *)n_local == 0 || sVar1 == 0) break;
    iVar2 = mk_wcwidth(*(uint *)n_local);
    if (iVar2 < 0) {
      return -1;
    }
    local_28 = iVar2 + local_28;
    n_local = n_local + 4;
  }
  return local_28;
}

Assistant:

int mk_wcswidth(const unsigned int *pwcs, size_t n)
{
  int w, width = 0;

  for (;*pwcs && n-- > 0; pwcs++)
    if ((w = mk_wcwidth(*pwcs)) < 0)
      return -1;
    else
      width += w;

  return width;
}